

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum_Base.h
# Opt level: O2

void Hacl_Bignum_Convert_bn_to_bytes_be_uint64(uint32_t len,uint64_t *b,uint8_t *res)

{
  ulong uVar1;
  long lVar2;
  uint8_t *__dest;
  ulong *puVar3;
  ulong __n;
  ulong uVar4;
  ulong *__s;
  undefined8 uStack_40;
  uint8_t *local_38;
  
  __n = (ulong)((len - 1 & 0xfffffff8) + 8);
  lVar2 = -(__n + 0xf & 0xfffffffffffffff0);
  __s = (ulong *)((long)&local_38 + lVar2);
  local_38 = res;
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x15188d;
  memset(__s,0,__n);
  puVar3 = __s;
  for (uVar4 = (ulong)(len - 1 >> 3); __dest = local_38, uVar4 != 0xffffffffffffffff;
      uVar4 = uVar4 - 1) {
    uVar1 = b[uVar4 & 0xffffffff];
    *puVar3 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
              | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18
              | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
    puVar3 = puVar3 + 1;
  }
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x1518c5;
  memcpy(__dest,(void *)((long)__s + (__n - len)),(ulong)len);
  return;
}

Assistant:

static inline void
Hacl_Bignum_Convert_bn_to_bytes_be_uint64(uint32_t len, uint64_t *b, uint8_t *res)
{
  uint32_t bnLen = (len - 1U) / 8U + 1U;
  uint32_t tmpLen = 8U * bnLen;
  KRML_CHECK_SIZE(sizeof (uint8_t), tmpLen);
  uint8_t tmp[tmpLen];
  memset(tmp, 0U, tmpLen * sizeof (uint8_t));
  for (uint32_t i = 0U; i < bnLen; i++)
  {
    store64_be(tmp + i * 8U, b[bnLen - i - 1U]);
  }
  memcpy(res, tmp + tmpLen - len, len * sizeof (uint8_t));
}